

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

size_t __thiscall TcpSocketImpl::Write(TcpSocketImpl *this,void *buf,size_t len)

{
  int iVar1;
  uchar *__s;
  pointer *__ptr;
  size_t sVar2;
  unsigned_long __n2;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  size_t local_30;
  size_t local_28;
  
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    sVar2 = 0;
    if (((len != 0) && (buf != (void *)0x0)) && (sVar2 = 0, this->m_bCloseReq == false)) {
      local_30 = len;
      if (BaseSocketImpl::s_fTrafficDebug.super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::operator()
                  (&BaseSocketImpl::s_fTrafficDebug,
                   (unsigned_short)(this->super_BaseSocketImpl).m_fSock,(char *)buf,len,true);
      }
      if (((this->m_fnSslInitDone).super__Function_base._M_manager == (_Manager_type)0x0) ||
         (iVar1 = (*(this->m_fnSslInitDone)._M_invoker)((_Any_data *)&this->m_fnSslInitDone),
         iVar1 == 1)) {
        if (((this->m_fnSslEncode).super__Function_base._M_manager == (_Manager_type)0x0) ||
           (local_38._M_head_impl = (uchar *)buf, local_28 = len,
           iVar1 = (*(this->m_fnSslEncode)._M_invoker)
                             ((_Any_data *)&this->m_fnSslEncode,&local_38._M_head_impl,&local_28),
           len = local_30, iVar1 == 0)) {
          __s = (uchar *)operator_new__(len);
          memset(__s,0,len);
          local_38._M_head_impl = __s;
          if (len != 0) {
            memcpy(__s,buf,len);
          }
          iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxOutDeque);
          if (iVar1 != 0) {
            std::__throw_system_error(iVar1);
          }
          LOCK();
          (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
               (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + local_30;
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                      *)&this->m_quOutData,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38
                     ,&local_30);
          pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
          if (local_38._M_head_impl != (uchar *)0x0) {
            operator_delete__(local_38._M_head_impl);
          }
        }
        else if (iVar1 < 1) {
          return local_30;
        }
        TriggerWriteThread(this);
        sVar2 = local_30;
      }
      else {
        local_38._M_head_impl = (uchar *)operator_new__(len);
        memcpy(local_38._M_head_impl,buf,len);
        iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mxOutDeque);
        if (iVar1 != 0) {
          std::__throw_system_error(iVar1);
        }
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                    *)&this->m_quTmpOutData,
                   (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38,
                   &local_30);
        sVar2 = local_30;
        pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
        if (local_38._M_head_impl != (uchar *)0x0) {
          operator_delete__(local_38._M_head_impl);
        }
      }
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t TcpSocketImpl::Write(const void* buf, size_t len)
{
    if (m_bStop == true || m_bCloseReq == true || buf == nullptr || len == 0)
        return 0;

    if (s_fTrafficDebug != nullptr)
        s_fTrafficDebug(static_cast<uint16_t>(m_fSock), static_cast<const char*>(buf), len, true);

    if (m_fnSslInitDone != nullptr && m_fnSslInitDone() != 1)
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        lock_guard<mutex> lock(m_mxOutDeque);
        m_quTmpOutData.emplace_back(move(tmp), len);
        return len;
    }

    int iRet = 0;
    if (m_fnSslEncode == nullptr || (iRet = m_fnSslEncode(reinterpret_cast<const uint8_t*>(buf), len), iRet == 0))
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        m_mxOutDeque.lock();
        m_atOutBytes += len;
        m_quOutData.emplace_back(move(tmp), len);
        m_mxOutDeque.unlock();

        iRet = 1;   // Trigger WriteThread
    }

    if (iRet > 0)
        TriggerWriteThread();

    return len;
}